

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O3

void check_newlinechar(compiler_common *common,int nltype,jump_list **backtracks,BOOL jumpifmatch)

{
  sljit_compiler *compiler;
  sljit_jump *psVar1;
  jump_list *pjVar2;
  sljit_jump *psVar3;
  sljit_label *psVar4;
  uint type;
  sljit_sw src2w;
  
  compiler = common->compiler;
  if (nltype == 2) {
    psVar1 = sljit_emit_cmp(compiler,0,1,0,0x40,0xd);
    if (jumpifmatch == 0) {
      psVar3 = sljit_emit_cmp(compiler,1,1,0,0x40,10);
      if ((compiler->error == 0) &&
         (pjVar2 = (jump_list *)ensure_abuf(compiler,0x10), pjVar2 != (jump_list *)0x0)) {
        pjVar2->next = *backtracks;
        pjVar2->jump = psVar3;
        *backtracks = pjVar2;
      }
      psVar4 = sljit_emit_label(compiler);
      if (psVar1 == (sljit_jump *)0x0) {
        return;
      }
      if (psVar4 == (sljit_label *)0x0) {
        return;
      }
      psVar1->flags = (psVar1->flags & 0xfffffffffffffffcU) + 1;
      (psVar1->u).label = psVar4;
      return;
    }
    if ((compiler->error == 0) &&
       (pjVar2 = (jump_list *)ensure_abuf(compiler,0x10), pjVar2 != (jump_list *)0x0)) {
      pjVar2->next = *backtracks;
      pjVar2->jump = psVar1;
      *backtracks = pjVar2;
    }
    src2w = 10;
    type = 0;
  }
  else {
    if (nltype == 1) {
      psVar1 = sljit_emit_jump(compiler,0x19);
      if ((compiler->error == 0) &&
         (pjVar2 = (jump_list *)ensure_abuf(compiler,0x10), pjVar2 != (jump_list *)0x0)) {
        pjVar2->next = common->anynewline;
        pjVar2->jump = psVar1;
        common->anynewline = pjVar2;
      }
      psVar1 = sljit_emit_jump(compiler,(uint)(jumpifmatch != 0));
      goto LAB_0010f5c9;
    }
    type = (uint)(jumpifmatch == 0);
    src2w = (sljit_sw)common->newline;
  }
  psVar1 = sljit_emit_cmp(compiler,type,1,0,0x40,src2w);
LAB_0010f5c9:
  if ((compiler->error == 0) &&
     (pjVar2 = (jump_list *)ensure_abuf(compiler,0x10), pjVar2 != (jump_list *)0x0)) {
    pjVar2->next = *backtracks;
    pjVar2->jump = psVar1;
    *backtracks = pjVar2;
  }
  return;
}

Assistant:

static void check_newlinechar(compiler_common *common, int nltype, jump_list **backtracks, BOOL jumpifmatch)
{
/* Character comes in TMP1. Checks if it is a newline. TMP2 may be destroyed. */
DEFINE_COMPILER;
struct sljit_jump *jump;

if (nltype == NLTYPE_ANY)
  {
  add_jump(compiler, &common->anynewline, JUMP(SLJIT_FAST_CALL));
  sljit_set_current_flags(compiler, SLJIT_SET_Z);
  add_jump(compiler, backtracks, JUMP(jumpifmatch ? SLJIT_NOT_ZERO : SLJIT_ZERO));
  }
else if (nltype == NLTYPE_ANYCRLF)
  {
  if (jumpifmatch)
    {
    add_jump(compiler, backtracks, CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_IMM, CHAR_CR));
    add_jump(compiler, backtracks, CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_IMM, CHAR_NL));
    }
  else
    {
    jump = CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_IMM, CHAR_CR);
    add_jump(compiler, backtracks, CMP(SLJIT_NOT_EQUAL, TMP1, 0, SLJIT_IMM, CHAR_NL));
    JUMPHERE(jump);
    }
  }
else
  {
  SLJIT_ASSERT(nltype == NLTYPE_FIXED && common->newline < 256);
  add_jump(compiler, backtracks, CMP(jumpifmatch ? SLJIT_EQUAL : SLJIT_NOT_EQUAL, TMP1, 0, SLJIT_IMM, common->newline));
  }
}